

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor.cpp
# Opt level: O1

streampos __thiscall
boost::iostreams::detail::file_descriptor_impl::seek
          (file_descriptor_impl *this,stream_offset off,seekdir way)

{
  streampos sVar1;
  detail adStack_28 [32];
  
  if (way != _S_beg) {
    way = (way != _S_cur) + _S_cur;
  }
  sVar1._M_off = lseek64(this->handle_,off,way);
  if (sVar1._M_off != 0xffffffffffffffff) {
    sVar1._M_state.__count = 0;
    sVar1._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    return sVar1;
  }
  system_failure_abi_cxx11_(adStack_28,"failed seeking");
  throw_exception<std::ios_base::failure[abi:cxx11]>((failure *)adStack_28);
}

Assistant:

std::streampos file_descriptor_impl::seek
    (stream_offset off, BOOST_IOS::seekdir way)
{
#ifdef BOOST_IOSTREAMS_WINDOWS
    LONG lDistanceToMove = static_cast<LONG>(off & 0xffffffff);
    LONG lDistanceToMoveHigh = static_cast<LONG>(off >> 32);
    DWORD dwResultLow =
        ::SetFilePointer( handle_,
                          lDistanceToMove,
                          &lDistanceToMoveHigh,
                          way == BOOST_IOS::beg ?
                              FILE_BEGIN :
                              way == BOOST_IOS::cur ?
                                FILE_CURRENT :
                                FILE_END );
    if ( dwResultLow == INVALID_SET_FILE_POINTER &&
         ::GetLastError() != NO_ERROR )
    {
        boost::throw_exception(system_failure("failed seeking"));
    } else {
       return offset_to_position(
                  (stream_offset(lDistanceToMoveHigh) << 32) + dwResultLow
              );
    }
#else // #ifdef BOOST_IOSTREAMS_WINDOWS
    if ( off > integer_traits<BOOST_IOSTREAMS_FD_OFFSET>::const_max ||
         off < integer_traits<BOOST_IOSTREAMS_FD_OFFSET>::const_min )
    {
        boost::throw_exception(BOOST_IOSTREAMS_FAILURE("bad offset"));
    }
    stream_offset result =
        BOOST_IOSTREAMS_FD_SEEK(
            handle_,
            static_cast<BOOST_IOSTREAMS_FD_OFFSET>(off),
            ( way == BOOST_IOS::beg ?
                  SEEK_SET :
                  way == BOOST_IOS::cur ?
                      SEEK_CUR :
                      SEEK_END ) 
        );
    if (result == -1)
        boost::throw_exception(system_failure("failed seeking"));
    return offset_to_position(result);
#endif // #ifdef BOOST_IOSTREAMS_WINDOWS
}